

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O0

void __thiscall gui::MenuBar::setMenu(MenuBar *this,MenuList *menu,size_t index)

{
  MenuList *this_00;
  unsigned_long *puVar1;
  MenuBar *in_RSI;
  long in_RDI;
  size_type local_20;
  unsigned_long local_18 [3];
  
  this_00 = (MenuList *)(in_RDI + 0x2e0);
  local_20 = std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>::size
                       ((vector<gui::MenuList,_std::allocator<gui::MenuList>_> *)(in_RDI + 0x2e0));
  puVar1 = std::min<unsigned_long>(local_18,&local_20);
  std::vector<gui::MenuList,_std::allocator<gui::MenuList>_>::operator[]
            ((vector<gui::MenuList,_std::allocator<gui::MenuList>_> *)this_00,*puVar1);
  MenuList::operator=((MenuList *)in_RSI,this_00);
  updateMenuBar((MenuBar *)index);
  selectMenu(in_RSI,(int)((ulong)this_00 >> 0x20),SUB81((ulong)this_00 >> 0x18,0));
  return;
}

Assistant:

void MenuBar::setMenu(const MenuList& menu, size_t index) {
    menus_[std::min(index, menus_.size())] = menu;
    updateMenuBar();
    selectMenu(selectedMenu_, false);
}